

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-sve.c
# Opt level: O3

_Bool trans_CNT_r(DisasContext_conflict1 *s,arg_CNT_r *a)

{
  TCGContext_conflict1 *tcg_ctx;
  _Bool _Var1;
  undefined1 extraout_AL;
  uint uVar2;
  uintptr_t o;
  TCGv_i64 pTVar3;
  
  tcg_ctx = s->uc->tcg_ctx;
  _Var1 = sve_access_check_aarch64(s);
  if (_Var1) {
    uVar2 = decode_pred_count(s->sve_len,a->pat,a->esz);
    pTVar3 = cpu_reg_aarch64(s,a->rd);
    tcg_gen_op2_aarch64(tcg_ctx,INDEX_op_movi_i64,(TCGArg)(pTVar3 + (long)tcg_ctx),
                        (ulong)(uVar2 * a->imm));
    return (_Bool)extraout_AL;
  }
  return _Var1;
}

Assistant:

static bool trans_CNT_r(DisasContext *s, arg_CNT_r *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    if (sve_access_check(s)) {
        unsigned fullsz = vec_full_reg_size(s);
        unsigned numelem = decode_pred_count(fullsz, a->pat, a->esz);
        tcg_gen_movi_i64(tcg_ctx, cpu_reg(s, a->rd), numelem * a->imm);
    }
    return true;
}